

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

void Omega_h::map_into<long>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  char *file;
  undefined1 local_180 [8];
  type f;
  __cxx11 local_140 [4];
  LO na;
  allocator local_109;
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [35];
  ScopedTimer local_a5;
  uint local_a4;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> *pWStack_a0;
  Int width_local;
  Write<signed_char> *b_data_local;
  LOs *a2b_local;
  Read<signed_char> *a_data_local;
  ulong local_40;
  ulong local_30;
  ulong local_20;
  ulong local_10;
  
  local_a4 = width;
  pWStack_a0 = b_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_109);
  std::operator+(local_e8,(char *)local_108);
  std::__cxx11::to_string(local_140,0x1b);
  std::operator+(local_c8,local_e8);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(&local_a5,"map_into",file);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  if (((ulong)(a2b->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a2b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a2b->write_).shared_alloc_.alloc >> 3;
  }
  f.a_data.write_.shared_alloc_.direct_ptr._4_4_ = (int)(local_10 >> 2);
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_20 >> 3) != f.a_data.write_.shared_alloc_.direct_ptr._4_4_ * local_a4) {
    if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = ((a_data->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
    }
    printf("ERROR: a_data.size= %d na= %d width= %d\n",local_30 >> 3 & 0xffffffff,
           local_10 >> 2 & 0xffffffff,(ulong)local_a4);
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_40 = ((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_40 = (ulong)(a_data->write_).shared_alloc_.alloc >> 3;
  }
  if ((int)(local_40 >> 3) == f.a_data.write_.shared_alloc_.direct_ptr._4_4_ * local_a4) {
    Read<int>::Read((Read<int> *)local_180,a2b);
    f.a2b.write_.shared_alloc_.direct_ptr._0_4_ = local_a4;
    Write<long>::Write((Write<long> *)&f.width,(Write<int> *)b_data);
    Read<long>::Read((Read<long> *)&f.b_data.shared_alloc_.direct_ptr,(Read<int> *)a_data);
    parallel_for<Omega_h::map_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::_lambda(int)_1_>
              (f.a_data.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_180);
    map_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::{lambda(int)#1}
    ::~Write((_lambda_int__1_ *)local_180);
    ScopedTimer::~ScopedTimer(&local_a5);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x1d);
}

Assistant:

void map_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size();
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto b = a2b[a];
    for (Int j = 0; j < width; ++j) {
      b_data[b * width + j] = a_data[a * width + j];
    }
  };
  parallel_for(na, std::move(f));
}